

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void __thiscall session::sendv(session *this,iobuf *bufs,int count)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  vector<iovec,_std::allocator<iovec>_> iov;
  char head_data [16];
  undefined1 local_50 [24];
  allocator_type local_38 [24];
  
  std::vector<iovec,_std::allocator<iovec>_>::vector
            ((vector<iovec,_std::allocator<iovec>_> *)local_50,(long)(count + 1),local_38);
  uVar3 = 0;
  iVar2 = 0;
  if (0 < count) {
    lVar7 = 0;
    iVar2 = 0;
    do {
      *(undefined8 *)((long)&((iovec *)(local_50._0_8_ + 0x10))->iov_base + lVar7) =
           *(undefined8 *)((long)&bufs->data + lVar7);
      iVar1 = *(int *)((long)&bufs->len + lVar7);
      *(long *)((long)&((iovec *)(local_50._0_8_ + 0x10))->iov_len + lVar7) = (long)iVar1;
      iVar2 = iVar2 + iVar1;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar7);
  }
  if ((((-1 < iVar2) && (uVar3 = 1, 0x7f < iVar2)) && (uVar3 = 2, 0x7ff < iVar2)) &&
     ((uVar3 = 3, 0xffff < iVar2 && (uVar3 = 4, 0x1fffff < iVar2)))) {
    uVar3 = (0x3ffffff < iVar2) + 5;
  }
  if (uVar3 == 0) {
    uVar4 = 0xffffffffffffffff;
  }
  else if (uVar3 == 1) {
    local_38[0] = SUB41(iVar2,0);
    uVar4 = 1;
  }
  else {
    uVar4 = (ulong)uVar3;
    bVar5 = 0x80;
    uVar6 = uVar4;
    do {
      local_38[uVar6 - 1] = (allocator_type)((byte)iVar2 & 0x3f | 0x80);
      bVar5 = bVar5 >> 1 | bVar5;
      iVar2 = iVar2 >> 6;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    local_38[0] = (allocator_type)((byte)local_38[0] | bVar5 * '\x02');
  }
  *(void **)local_50._0_8_ = local_38;
  *(ulong *)(local_50._0_8_ + 8) = uVar4;
  transmit(this,(iovec *)local_50._0_8_,(int)((ulong)(local_50._8_8_ - local_50._0_8_) >> 4));
  if ((iovec *)local_50._0_8_ != (iovec *)0x0) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ - local_50._0_8_);
  }
  return;
}

Assistant:

void session::sendv(iobuf bufs[], int count)
{
    int total = 0;
    std::vector<iovec> iov(count + 1);
    for (int i = 0; i < count; i++)
    {
        iov[i+1].iov_base = (char*)bufs[i].data;
        iov[i+1].iov_len = bufs[i].len;
        total += bufs[i].len;
    }

    char head_data[16];
    int head_len = encode_head(head_data, sizeof(head_data), total);
    iov[0].iov_base = head_data;
    iov[0].iov_len = head_len;
    transmit(iov.data(), iov.size());
}